

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::GradX
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  TPZFNMatrix<54,_double> cornerco;
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (gradx,3,2);
  TPZFNMatrix<54,_double>::TPZFNMatrix(&cornerco,3,8);
  CornerCoordinates(this,&cornerco.super_TPZFMatrix<double>);
  pzgeom::TPZQuadraticQuad::GradX<double>(&cornerco.super_TPZFMatrix<double>,par,gradx);
  TPZFNMatrix<54,_double>::~TPZFNMatrix(&cornerco);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<REAL> &par, TPZFMatrix<REAL> &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}